

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::EmitSnapHandler
               (SnapHandler *snapHandler,FileWriter *writer,Separator separator)

{
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  byte local_21;
  uint local_20;
  uint32 i;
  Separator separator_local;
  FileWriter *writer_local;
  SnapHandler *snapHandler_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteAddr(writer,handlerId,snapHandler->HandlerId,NoSeparator);
  FileWriter::WriteUInt32(writer,extensibleFlag,(uint)snapHandler->IsExtensibleFlag,CommaSeparator);
  FileWriter::WriteUInt32(writer,inlineSlotCapacity,snapHandler->InlineSlotCapacity,CommaSeparator);
  FileWriter::WriteUInt32(writer,totalSlotCapacity,snapHandler->TotalSlotCapacity,CommaSeparator);
  FileWriter::WriteLengthValue(writer,snapHandler->MaxPropertyIndex,CommaSeparator);
  if (snapHandler->MaxPropertyIndex != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    (*writer->_vptr_FileWriter[8])(writer,1);
    uVar1 = extraout_RDX;
    for (local_20 = 0; local_20 < snapHandler->MaxPropertyIndex; local_20 = local_20 + 1) {
      local_21 = 3;
      if (local_20 == 0) {
        local_21 = 2;
      }
      (*writer->_vptr_FileWriter[6])
                (writer,(ulong)local_21,CONCAT71((int7)((ulong)uVar1 >> 8),2),
                 (ulong)CONCAT31((int3)(local_20 >> 8),local_21));
      FileWriter::WriteUInt32
                (writer,propertyId,snapHandler->PropertyInfoArray[local_20].PropertyRecordId,
                 NoSeparator);
      FileWriter::WriteTag<TTD::NSSnapType::SnapEntryDataKindTag>
                (writer,dataKindTag,snapHandler->PropertyInfoArray[local_20].DataKind,CommaSeparator
                );
      FileWriter::WriteTag<TTD::NSSnapType::SnapAttributeTag>
                (writer,attributeTag,snapHandler->PropertyInfoArray[local_20].AttributeInfo,
                 CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar1 = extraout_RDX_00;
    }
    (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
    (*writer->_vptr_FileWriter[5])(writer,2);
  }
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapHandler(const SnapHandler* snapHandler, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::handlerId, snapHandler->HandlerId);

            writer->WriteUInt32(NSTokens::Key::extensibleFlag, snapHandler->IsExtensibleFlag, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::inlineSlotCapacity, snapHandler->InlineSlotCapacity, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::totalSlotCapacity, snapHandler->TotalSlotCapacity, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapHandler->MaxPropertyIndex, NSTokens::Separator::CommaSeparator);

            if(snapHandler->MaxPropertyIndex > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                writer->AdjustIndent(1);
                for(uint32 i = 0; i < snapHandler->MaxPropertyIndex; ++i)
                {
                    writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    writer->WriteUInt32(NSTokens::Key::propertyId, snapHandler->PropertyInfoArray[i].PropertyRecordId);
                    writer->WriteTag<SnapEntryDataKindTag>(NSTokens::Key::dataKindTag, snapHandler->PropertyInfoArray[i].DataKind, NSTokens::Separator::CommaSeparator);
                    writer->WriteTag<SnapAttributeTag>(NSTokens::Key::attributeTag, snapHandler->PropertyInfoArray[i].AttributeInfo, NSTokens::Separator::CommaSeparator);
                    writer->WriteRecordEnd();
                }
                writer->AdjustIndent(-1);
                writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
            }

            writer->WriteRecordEnd();
        }